

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O0

void rw::flipDXT5(uint8 *dst,uint8 *src,uint32 width,uint32 height)

{
  uint uVar1;
  uint uVar2;
  uint8 *local_50;
  uint8 *d_1;
  uint8 *s_1;
  uint8 *d;
  uint8 *s;
  int bh;
  int bw;
  int y;
  int x;
  uint32 height_local;
  uint32 width_local;
  uint8 *src_local;
  uint8 *dst_local;
  
  uVar1 = width + 3 >> 2;
  uVar2 = height + 3 >> 2;
  if (height < 4) {
    if (height == 2) {
      s_1 = dst;
      d = src;
      for (bw = 0; bw < (int)uVar1; bw = bw + 1) {
        flipAlphaBlock5_half(s_1,d);
        flipBlock_half(s_1 + 8,d + 8);
        d = d + 0x10;
        s_1 = s_1 + 0x10;
      }
    }
    else {
      memcpy(dst,src,(long)(int)(uVar1 << 4));
    }
  }
  else {
    src_local = dst + (int)(uVar1 * 0x10 * uVar2);
    _height_local = src;
    for (bh = 0; bh < (int)uVar2; bh = bh + 1) {
      src_local = src_local + -(long)(int)(uVar1 << 4);
      d_1 = _height_local;
      local_50 = src_local;
      for (bw = 0; bw < (int)uVar1; bw = bw + 1) {
        flipAlphaBlock5(local_50,d_1);
        flipBlock(local_50 + 8,d_1 + 8);
        d_1 = d_1 + 0x10;
        local_50 = local_50 + 0x10;
      }
      _height_local = _height_local + (int)(uVar1 << 4);
    }
  }
  return;
}

Assistant:

void
flipDXT5(uint8 *dst, uint8 *src, uint32 width, uint32 height)
{
	int x, y;
	int bw = (width+3)/4;
	int bh = (height+3)/4;
	if(height < 4){
		// used pixels are always at the top
		// so don't swap the full 4 rows
		if(height == 2){
			uint8 *s = src;
			uint8 *d = dst;
			for(x = 0; x < bw; x++){
				flipAlphaBlock5_half(d, s);
				flipBlock_half(d+8, s+8);
				s += 16;
				d += 16;
			}
		}else
			memcpy(dst, src, 16*bw);
		return;
	}
	dst += 16*bw*bh;
	for(y = 0; y < bh; y++){
		dst -= 16*bw;
		uint8 *s = src;
		uint8 *d = dst;
		for(x = 0; x < bw; x++){
			flipAlphaBlock5(d, s);
			flipBlock(d+8, s+8);
			s += 16;
			d += 16;
		}
		src += 16*bw;
	}
}